

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall soul::heart::BranchIf::visitExpressions(BranchIf *this,ExpressionVisitorFn fn)

{
  Expression *pEVar1;
  size_t sVar2;
  pool_ref<soul::heart::Expression> *ppVar3;
  long lVar4;
  pool_ref<soul::heart::Expression> arg;
  AccessType local_44;
  pool_ref<soul::heart::Expression> local_40;
  BranchIf *local_38;
  
  pEVar1 = (this->condition).object;
  (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
  local_40.object = (Expression *)((ulong)local_40.object._4_4_ << 0x20);
  if ((fn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*fn->_M_invoker)((_Any_data *)fn,&this->condition,(AccessType *)&local_40);
    sVar2 = this->targetArgs[0].numActive;
    local_38 = this;
    if (sVar2 != 0) {
      ppVar3 = this->targetArgs[0].items;
      lVar4 = 0;
      do {
        local_40.object = *(Expression **)((long)&ppVar3->object + lVar4);
        (*((local_40.object)->super_Object)._vptr_Object[3])(local_40.object,fn,0);
        local_44 = read;
        if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_002487e3;
        (*fn->_M_invoker)((_Any_data *)fn,&local_40,&local_44);
        lVar4 = lVar4 + 8;
      } while (sVar2 << 3 != lVar4);
    }
    sVar2 = local_38->targetArgs[1].numActive;
    if (sVar2 != 0) {
      ppVar3 = local_38->targetArgs[1].items;
      lVar4 = 0;
      do {
        local_40.object = *(Expression **)((long)&ppVar3->object + lVar4);
        (*((local_40.object)->super_Object)._vptr_Object[3])(local_40.object,fn,0);
        local_44 = read;
        if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_002487e3;
        (*fn->_M_invoker)((_Any_data *)fn,&local_40,&local_44);
        lVar4 = lVar4 + 8;
      } while (sVar2 << 3 != lVar4);
    }
    return;
  }
LAB_002487e3:
  std::__throw_bad_function_call();
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn) override
        {
            condition->visitExpressions (fn, AccessType::read);
            fn (condition, AccessType::read);

            for (auto arg : targetArgs[0])
            {
                arg->visitExpressions (fn, AccessType::read);
                fn (arg, AccessType::read);
            }

            for (auto arg : targetArgs[1])
            {
                arg->visitExpressions (fn, AccessType::read);
                fn (arg, AccessType::read);
            }

        }